

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMiscMatrixAlgo.cpp
# Opt level: O3

M44f * anon_unknown.dwarf_b38c8::createRandomMat
                 (M44f *__return_storage_ptr__,Rand48 *random,V3f *trans,V3f *rot,V3f *scale)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  undefined7 extraout_var;
  int j;
  long lVar5;
  float (*pafVar6) [4];
  int k;
  long lVar7;
  float fVar8;
  float fVar9;
  double dVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  V3f s;
  V3f sh;
  V3f r;
  V3f t;
  undefined8 local_c8;
  float local_c0;
  float local_bc;
  float local_b8;
  V3f local_b4;
  float local_a8;
  float local_98;
  double local_88;
  double local_78;
  V3f *local_68;
  V3f *local_60;
  Vec3<float> local_54;
  V3f local_48;
  V3f local_3c;
  
  __return_storage_ptr__->x[0][0] = 1.0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 8) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->x[0] + 3) = 0;
  __return_storage_ptr__->x[1][1] = 1.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 0xc) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
  __return_storage_ptr__->x[2][2] = 1.0;
  *(undefined8 *)(__return_storage_ptr__->x[2] + 3) = 0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 8) = 0.0;
  __return_storage_ptr__->x[3][3] = 1.0;
  local_68 = rot;
  local_60 = trans;
  getRandTRS(random,&local_3c,&local_48,&local_b4);
  fVar8 = __return_storage_ptr__->x[0][1];
  fVar1 = __return_storage_ptr__->x[0][2];
  fVar2 = __return_storage_ptr__->x[0][3];
  fVar3 = __return_storage_ptr__->x[1][1];
  fVar15 = __return_storage_ptr__->x[1][2];
  fVar16 = __return_storage_ptr__->x[1][3];
  fVar17 = __return_storage_ptr__->x[2][1];
  fVar18 = __return_storage_ptr__->x[2][2];
  fVar9 = __return_storage_ptr__->x[2][3];
  fVar11 = __return_storage_ptr__->x[3][1];
  fVar12 = __return_storage_ptr__->x[3][2];
  fVar13 = __return_storage_ptr__->x[3][3];
  __return_storage_ptr__->x[3][0] =
       local_3c.z * __return_storage_ptr__->x[2][0] +
       local_3c.x * __return_storage_ptr__->x[0][0] + __return_storage_ptr__->x[1][0] * local_3c.y +
       __return_storage_ptr__->x[3][0];
  __return_storage_ptr__->x[3][1] =
       local_3c.z * fVar17 + local_3c.x * fVar8 + fVar3 * local_3c.y + fVar11;
  __return_storage_ptr__->x[3][2] =
       local_3c.z * fVar18 + local_3c.x * fVar1 + fVar15 * local_3c.y + fVar12;
  __return_storage_ptr__->x[3][3] =
       local_3c.z * fVar9 + local_3c.x * fVar2 + fVar16 * local_3c.y + fVar13;
  local_98 = local_48.z;
  local_78._0_4_ = cosf(local_48.z);
  local_a8 = local_48.y;
  local_88._0_4_ = cosf(local_48.y);
  local_bc = local_48.x;
  local_b8 = cosf(local_48.x);
  local_98 = sinf(local_98);
  local_a8 = sinf(local_a8);
  fVar8 = sinf(local_bc);
  fVar20 = local_78._0_4_ * local_88._0_4_;
  fVar22 = local_88._0_4_ * local_98;
  fVar14 = local_78._0_4_ * local_a8 * fVar8 - local_98 * local_b8;
  fVar23 = local_78._0_4_ * local_b8 + local_98 * local_a8 * fVar8;
  fVar21 = local_88._0_4_ * fVar8;
  fVar25 = local_98 * fVar8 + local_b8 * local_78._0_4_ * local_a8;
  fVar19 = local_b8 * local_98 * local_a8 - local_78._0_4_ * fVar8;
  fVar24 = local_88._0_4_ * local_b8;
  fVar8 = __return_storage_ptr__->x[0][0];
  fVar1 = __return_storage_ptr__->x[0][1];
  fVar2 = __return_storage_ptr__->x[0][2];
  fVar3 = __return_storage_ptr__->x[0][3];
  fVar15 = __return_storage_ptr__->x[1][0];
  fVar16 = __return_storage_ptr__->x[1][1];
  fVar17 = __return_storage_ptr__->x[1][2];
  fVar18 = __return_storage_ptr__->x[1][3];
  fVar9 = __return_storage_ptr__->x[2][0];
  fVar11 = __return_storage_ptr__->x[2][1];
  fVar12 = __return_storage_ptr__->x[2][2];
  fVar13 = __return_storage_ptr__->x[2][3];
  __return_storage_ptr__->x[0][0] = (fVar20 * fVar8 + fVar22 * fVar15) - local_a8 * fVar9;
  __return_storage_ptr__->x[0][1] = (fVar20 * fVar1 + fVar22 * fVar16) - local_a8 * fVar11;
  __return_storage_ptr__->x[0][2] = (fVar20 * fVar2 + fVar22 * fVar17) - local_a8 * fVar12;
  __return_storage_ptr__->x[0][3] = (fVar20 * fVar3 + fVar22 * fVar18) - local_a8 * fVar13;
  __return_storage_ptr__->x[1][0] = fVar21 * fVar9 + fVar14 * fVar8 + fVar23 * fVar15;
  __return_storage_ptr__->x[1][1] = fVar21 * fVar11 + fVar14 * fVar1 + fVar23 * fVar16;
  __return_storage_ptr__->x[1][2] = fVar21 * fVar12 + fVar14 * fVar2 + fVar23 * fVar17;
  __return_storage_ptr__->x[1][3] = fVar21 * fVar13 + fVar14 * fVar3 + fVar23 * fVar18;
  __return_storage_ptr__->x[2][0] = fVar24 * fVar9 + fVar25 * fVar8 + fVar19 * fVar15;
  __return_storage_ptr__->x[2][1] = fVar24 * fVar11 + fVar25 * fVar1 + fVar19 * fVar16;
  __return_storage_ptr__->x[2][2] = fVar24 * fVar12 + fVar25 * fVar2 + fVar19 * fVar17;
  __return_storage_ptr__->x[2][3] = fVar24 * fVar13 + fVar25 * fVar3 + fVar19 * fVar18;
  local_78 = (double)Imath_3_2::erand48(random->_state);
  local_88 = (double)Imath_3_2::erand48(random->_state);
  dVar10 = (double)Imath_3_2::erand48(random->_state);
  local_c0 = (float)((1.0 - dVar10) * 1e-06 + dVar10 + dVar10);
  local_c8 = CONCAT44((float)((1.0 - local_88) * 1e-06 + local_88 + local_88),
                      (float)((1.0 - local_78) * 1e-06 + local_78 + local_78));
  lVar5 = 0;
  do {
    dVar10 = (double)Imath_3_2::erand48(random->_state);
    if (0.5 <= (1.0 - dVar10) * 0.0 + dVar10) {
      *(uint *)((long)&local_c8 + lVar5 * 4) = *(uint *)((long)&local_c8 + lVar5 * 4) ^ 0x80000000;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  fVar8 = __return_storage_ptr__->x[0][0];
  fVar1 = __return_storage_ptr__->x[0][1];
  fVar2 = __return_storage_ptr__->x[0][2];
  fVar3 = __return_storage_ptr__->x[0][3];
  fVar15 = __return_storage_ptr__->x[1][0];
  fVar16 = __return_storage_ptr__->x[1][1];
  fVar17 = __return_storage_ptr__->x[1][2];
  fVar18 = __return_storage_ptr__->x[1][3];
  fVar9 = local_c8._4_4_ * fVar8 + local_c0 * fVar15 + __return_storage_ptr__->x[2][0];
  fVar11 = local_c8._4_4_ * fVar1 + local_c0 * fVar16 + __return_storage_ptr__->x[2][1];
  fVar12 = local_c8._4_4_ * fVar2 + local_c0 * fVar17 + __return_storage_ptr__->x[2][2];
  fVar13 = local_c8._4_4_ * fVar3 + local_c0 * fVar18 + __return_storage_ptr__->x[2][3];
  __return_storage_ptr__->x[2][0] = fVar9;
  __return_storage_ptr__->x[2][1] = fVar11;
  __return_storage_ptr__->x[2][2] = fVar12;
  __return_storage_ptr__->x[2][3] = fVar13;
  fVar15 = (float)local_c8 * fVar8 + fVar15;
  fVar16 = (float)local_c8 * fVar1 + fVar16;
  fVar17 = (float)local_c8 * fVar2 + fVar17;
  fVar18 = (float)local_c8 * fVar3 + fVar18;
  __return_storage_ptr__->x[1][0] = fVar15;
  __return_storage_ptr__->x[1][1] = fVar16;
  __return_storage_ptr__->x[1][2] = fVar17;
  __return_storage_ptr__->x[1][3] = fVar18;
  __return_storage_ptr__->x[0][0] = local_b4.x * fVar8;
  __return_storage_ptr__->x[0][1] = local_b4.x * fVar1;
  __return_storage_ptr__->x[0][2] = local_b4.x * fVar2;
  __return_storage_ptr__->x[0][3] = local_b4.x * fVar3;
  __return_storage_ptr__->x[1][0] = local_b4.y * fVar15;
  __return_storage_ptr__->x[1][1] = local_b4.y * fVar16;
  __return_storage_ptr__->x[1][2] = local_b4.y * fVar17;
  __return_storage_ptr__->x[1][3] = local_b4.y * fVar18;
  __return_storage_ptr__->x[2][0] = local_b4.z * fVar9;
  __return_storage_ptr__->x[2][1] = local_b4.z * fVar11;
  __return_storage_ptr__->x[2][2] = local_b4.z * fVar12;
  __return_storage_ptr__->x[2][3] = local_b4.z * fVar13;
  lVar5 = 0;
  pafVar6 = (float (*) [4])__return_storage_ptr__;
  do {
    lVar7 = 0;
    do {
      dVar10 = (double)Imath_3_2::erand48(random->_state);
      (*(float (*) [4])*pafVar6)[lVar7] =
           (float)((1.0 - dVar10) * -1e-07 + dVar10 * 1e-07) + (*(float (*) [4])*pafVar6)[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 3);
    lVar5 = lVar5 + 1;
    pafVar6 = pafVar6 + 1;
  } while (lVar5 != 4);
  bVar4 = Imath_3_2::extractSHRT<float>
                    (__return_storage_ptr__,scale,&local_54,local_68,local_60,true,Default);
  return (M44f *)CONCAT71(extraout_var,bVar4);
}

Assistant:

M44f
createRandomMat (Rand48& random, V3f& trans, V3f& rot, V3f& scale)
{

    M44f M;
    V3f  t, r, s;
    getRandTRS (random, t, r, s);

    M.translate (t);
    M.rotate (r);

    // Shear M.
    V3f h (
        float(random.nextf (0.000001, 2.0)),
        float(random.nextf (0.000001, 2.0)),
        float(random.nextf (0.000001, 2.0)));

    for (int j = 0; j < 3; j++)
        if (random.nextf (0.0, 1.0) >= 0.5) h[j] *= -1;
    M.shear (h);

    M.scale (s);

    //
    // Add a small random error to the elements of M
    //
    for (int j = 0; j < 4; ++j)
        for (int k = 0; k < 3; ++k)
            M[j][k] += float(random.nextf (-1e-7, 1e-7));

    V3f sh;
    extractSHRT (M, scale, sh, rot, trans);

    debug (("Scale   : %f %f %f\n", s[0], s[1], s[2]));
    debug (("Shear   : %f %f %f\n", h[0], h[1], h[2]));
    debug (("Rot     : %f %f %f\n", r[0], r[1], r[2]));
    debug (("Trans   : %f %f %f\n", t[0], t[1], t[2]));

    return M;
}